

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void read_numeral(LexState *ls,SemInfo *seminfo)

{
  char cVar1;
  ushort uVar2;
  ZIO *pZVar3;
  byte *pbVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  ushort **ppuVar8;
  size_t sVar9;
  ulong uVar10;
  
  do {
    save(ls,ls->current);
    pZVar3 = ls->z;
    sVar9 = pZVar3->n;
    pZVar3->n = pZVar3->n - 1;
    if (sVar9 == 0) {
      uVar6 = luaZ_fill(pZVar3);
    }
    else {
      pbVar4 = (byte *)pZVar3->p;
      pZVar3->p = (char *)(pbVar4 + 1);
      uVar6 = (uint)*pbVar4;
    }
    ls->current = uVar6;
    ppuVar8 = __ctype_b_loc();
  } while ((uVar6 == 0x2e) || (((*ppuVar8)[(int)uVar6] & 0x800) != 0));
  iVar7 = check_next(ls,"Ee");
  if (iVar7 != 0) {
    check_next(ls,"+-");
  }
  uVar10 = (ulong)ls->current;
  if (uVar10 == 0x5f) goto LAB_0010c6b4;
  uVar2 = (*ppuVar8)[uVar10];
  while ((uVar2 & 8) != 0) {
LAB_0010c6b4:
    do {
      save(ls,(int)uVar10);
      pZVar3 = ls->z;
      sVar9 = pZVar3->n;
      pZVar3->n = pZVar3->n - 1;
      if (sVar9 == 0) {
        uVar6 = luaZ_fill(pZVar3);
        uVar10 = (ulong)uVar6;
      }
      else {
        pbVar4 = (byte *)pZVar3->p;
        pZVar3->p = (char *)(pbVar4 + 1);
        uVar10 = (ulong)*pbVar4;
      }
      iVar7 = (int)uVar10;
      ls->current = iVar7;
    } while (iVar7 == 0x5f);
    uVar2 = (*ppuVar8)[iVar7];
  }
  save(ls,0);
  sVar9 = ls->buff->n;
  if (sVar9 != 0) {
    cVar1 = ls->decpoint;
    pcVar5 = ls->buff->buffer;
    do {
      if (pcVar5[sVar9 - 1] == '.') {
        pcVar5[sVar9 - 1] = cVar1;
      }
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  iVar7 = luaO_str2d(ls->buff->buffer,&seminfo->r);
  if (iVar7 != 0) {
    return;
  }
  luaX_lexerror(ls,"malformed number",0x11c);
}

Assistant:

static void read_numeral(LexState*ls,SemInfo*seminfo){
do{
save_and_next(ls);
}while(isdigit(ls->current)||ls->current=='.');
if(check_next(ls,"Ee"))
check_next(ls,"+-");
while(isalnum(ls->current)||ls->current=='_')
save_and_next(ls);
save(ls,'\0');
buffreplace(ls,'.',ls->decpoint);
if(!luaO_str2d(luaZ_buffer(ls->buff),&seminfo->r))
luaX_lexerror(ls,"malformed number",TK_NUMBER);
}